

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void CallSignalWithSingleConnection_SignalShouldBeCalled(void)

{
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int in_ESI;
  int __sig;
  connection local_68;
  anon_class_16_3_b23de825 local_50;
  undefined1 local_40 [8];
  function<void_(int,_bool)> receiver;
  undefined1 local_18 [2];
  bool receiverCalled;
  bool paramTwo;
  int paramOne;
  signal<void_(int,_bool)> sg;
  
  TestRunner::StartTest("CallSignalWithSingleConnection_SignalShouldBeCalled");
  lsignal::signal<void_(int,_bool)>::signal((signal<void_(int,_bool)> *)local_18,in_ESI,__handler);
  receiver._M_invoker._4_4_ = 7;
  receiver._M_invoker._3_1_ = 1;
  receiver._M_invoker._2_1_ = 0;
  local_50.receiverCalled = (bool *)((long)&receiver._M_invoker + 2);
  local_50.paramOne = 7;
  local_50.paramTwo = true;
  std::function<void(int,bool)>::
  function<CallSignalWithSingleConnection_SignalShouldBeCalled()::__0,void>
            ((function<void(int,bool)> *)local_40,&local_50);
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_68,(int)(signal<void_(int,_bool)> *)local_18,
             (sockaddr *)local_40,0);
  lsignal::connection::~connection(&local_68);
  lsignal::signal<void_(int,_bool)>::operator()
            ((signal<void_(int,_bool)> *)local_18,receiver._M_invoker._4_4_,
             (bool)(receiver._M_invoker._3_1_ & 1));
  __sig = 1;
  AssertHelper::VerifyValue((bool)(receiver._M_invoker._2_1_ & 1),true,"Receiver should be called.")
  ;
  std::function<void_(int,_bool)>::~function((function<void_(int,_bool)> *)local_40);
  lsignal::signal<void_(int,_bool)>::~signal
            ((signal<void_(int,_bool)> *)local_18,__sig,__handler_00);
  return;
}

Assistant:

void CallSignalWithSingleConnection_SignalShouldBeCalled()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(p0, paramOne, "First parameter should be as expected.");
		AssertHelper::VerifyValue(p1, paramTwo, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	sg(paramOne, paramTwo);

	AssertHelper::VerifyValue(receiverCalled, true, "Receiver should be called.");
}